

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O2

bool S2::VertexCrossing(S2Point *a,S2Point *b,S2Point *c,S2Point *d)

{
  bool bVar1;
  bool bVar2;
  S2Point *pSVar3;
  S2Point local_40;
  
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)a,b);
  if ((bVar1) ||
     (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)c,d), bVar1)) {
    bVar1 = false;
  }
  else {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)a,c);
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)b,d);
    pSVar3 = a;
    if (bVar1) {
      if (bVar2) {
        return true;
      }
      Ortho(&local_40,a);
      a = b;
      c = d;
    }
    else if (bVar2) {
      Ortho(&local_40,b);
      pSVar3 = b;
    }
    else {
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)a,d);
      bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)b,c);
      if (bVar1) {
        if (bVar2) {
          return true;
        }
        Ortho(&local_40,a);
        a = b;
      }
      else {
        if (!bVar2) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crossings.cc"
                     ,0x61,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)local_40.c_[1],"VertexCrossing called with 4 distinct vertices"
                         );
          abort();
        }
        Ortho(&local_40,b);
        pSVar3 = b;
        c = d;
      }
    }
    bVar1 = s2pred::OrderedCCW(&local_40,c,a,pSVar3);
  }
  return bVar1;
}

Assistant:

bool VertexCrossing(const S2Point& a, const S2Point& b,
                    const S2Point& c, const S2Point& d) {
  // If A == B or C == D there is no intersection.  We need to check this
  // case first in case 3 or more input points are identical.
  if (a == b || c == d) return false;

  // If any other pair of vertices is equal, there is a crossing if and only
  // if OrderedCCW() indicates that the edge AB is further CCW around the
  // shared vertex O (either A or B) than the edge CD, starting from an
  // arbitrary fixed reference point.
  //
  // Optimization: if AB=CD or AB=DC, we can avoid most of the calculations.
  if (a == c) return (b == d) || s2pred::OrderedCCW(S2::Ortho(a), d, b, a);
  if (b == d) return s2pred::OrderedCCW(S2::Ortho(b), c, a, b);

  if (a == d) return (b == c) || s2pred::OrderedCCW(S2::Ortho(a), c, b, a);
  if (b == c) return s2pred::OrderedCCW(S2::Ortho(b), d, a, b);

  S2_LOG(DFATAL) << "VertexCrossing called with 4 distinct vertices";
  return false;
}